

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_connection::second_tick(peer_connection *this,int tick_interval_ms)

{
  undefined1 *puVar1;
  int *piVar2;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *plVar3;
  byte bVar4;
  int32_t iVar5;
  session_settings *psVar6;
  session_interface *psVar7;
  torrent_peer *ptVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  _WordT _Var11;
  torrent *this_00;
  bool bVar12;
  char cVar13;
  piece_index_t new_piece;
  int iVar14;
  int iVar15;
  undefined4 extraout_var;
  alert_manager *paVar16;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar17;
  long lVar18;
  _List_node_base *p_Var19;
  torrent *ptVar20;
  const_iterator __end2;
  element_type *peVar21;
  long lVar22;
  byte bVar23;
  ulong uVar24;
  bool bVar25;
  shared_ptr<libtorrent::aux::peer_connection> me;
  undefined1 local_90 [8];
  error_category *local_88;
  duration local_80;
  torrent *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  int local_68;
  int local_64;
  undefined1 local_60 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_88 = (error_category *)local_90;
  local_64 = tick_interval_ms;
  local_80.__r = (rep)time_now();
  ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::peer_connection,void>
            ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
             (local_60 + 0x20),
             (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
  local_70 = (this->super_peer_connection_hot_members).m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_70 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar21 = (element_type *)0x0;
  }
  else {
    iVar14 = local_70->_M_use_count;
    peVar21 = (element_type *)0x0;
    do {
      if (iVar14 == 0) {
        local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_002475ab;
      }
      LOCK();
      iVar15 = local_70->_M_use_count;
      bVar25 = iVar14 == iVar15;
      if (bVar25) {
        local_70->_M_use_count = iVar14 + 1;
        iVar15 = iVar14;
      }
      iVar14 = iVar15;
      UNLOCK();
    } while (!bVar25);
    if (local_70->_M_use_count == 0) {
      peVar21 = (element_type *)0x0;
    }
    else {
      peVar21 = (this->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
  }
LAB_002475ab:
  psVar6 = (this->super_peer_connection_hot_members).m_settings;
  local_88._0_1_ = 0;
  local_90 = (undefined1  [8])&psVar6->m_mutex;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
  local_88._0_1_ = true;
  _Var11 = (psVar6->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  local_78 = peVar21;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
  ptVar20 = local_78;
  if (((uint)_Var11 >> 0x10 & 1) == 0) {
LAB_002475eb:
    ptVar20 = local_78;
    if (local_78 != (torrent *)0x0) goto LAB_0024766d;
LAB_00247811:
    bVar25 = false;
    ptVar20 = local_78;
  }
  else {
    if (local_78 == (torrent *)0x0) goto LAB_00247811;
    psVar7 = (this->super_peer_connection_hot_members).m_ses;
    iVar14 = (*(psVar7->super_session_logger)._vptr_session_logger[0x35])
                       (psVar7,&(this->super_peer_connection_hot_members).field_0x2c,
                        (ulong)*(uint *)&(this->m_statistics).m_stat.
                                         super_array<libtorrent::aux::stat_channel,_6UL>.field_0x58,
                        (ulong)*(uint *)&(this->m_statistics).m_stat.
                                         super_array<libtorrent::aux::stat_channel,_6UL>.field_0x48)
    ;
    psVar7 = (this->super_peer_connection_hot_members).m_ses;
    iVar15 = (*(psVar7->super_session_logger)._vptr_session_logger[0x35])
                       (psVar7,&ptVar20->super_peer_class_set,
                        (ulong)*(uint *)&(this->m_statistics).m_stat.
                                         super_array<libtorrent::aux::stat_channel,_6UL>.field_0x58,
                        (ulong)*(uint *)&(this->m_statistics).m_stat.
                                         super_array<libtorrent::aux::stat_channel,_6UL>.field_0x48)
    ;
    bVar23 = (byte)iVar15 | (byte)iVar14;
    if ((bVar23 != 0) &&
       (paVar16 = torrent::alerts(ptVar20), this_00 = local_78,
       ((paVar16->m_alert_mask)._M_i.m_val >> 9 & 1) != 0)) {
      iVar14 = 0;
      iVar15 = 2;
      bVar25 = true;
      do {
        bVar12 = bVar25;
        if ((bVar23 >> iVar14 & 1) != 0) {
          paVar16 = torrent::alerts(this_00);
          torrent::get_handle((torrent *)local_60);
          local_90._0_4_ = iVar15;
          alert_manager::
          emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                    (paVar16,(torrent_handle *)local_60,(performance_warning_t *)local_90);
          if ((piece_picker *)local_60._8_8_ != (piece_picker *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              piVar2 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      ).
                                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 4);
              iVar14 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
            }
            else {
              iVar14 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                                       super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                       ).
                                       super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4);
              *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                              super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                              ).
                              super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar14 + -1;
            }
            if (iVar14 == 1) {
              (*(code *)(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ).
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_start[3])();
            }
          }
        }
        iVar14 = 1;
        iVar15 = 3;
        bVar25 = false;
      } while (bVar12);
      goto LAB_002475eb;
    }
LAB_0024766d:
    bVar23 = (this->super_peer_connection_hot_members).field_0x28;
    bVar25 = true;
    if ((bVar23 & 1) == 0) {
      if (((((~bVar23 & 0x14) == 0) &&
           ((this->m_download_queue).
            super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
            .
            super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->m_download_queue).
            super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
            .
            super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_finish)) &&
          ((this->m_request_queue).
           super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (this->m_request_queue).
           super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
           ._M_impl.super__Vector_impl_data._M_finish)) &&
         (lVar22 = (this->m_connect).__d.__r,
         (long)(this->m_last_request).m_time_diff.__r * 1000000 + lVar22 <=
         local_80.__r + -5000000000)) {
        auVar9 = SEXT816(local_80.__r - lVar22) * SEXT816(0x431bde82d7b634db);
        (this->m_last_request).m_time_diff.__r =
             (int)(auVar9._8_8_ >> 0x12) - (auVar9._12_4_ >> 0x1f);
        bVar25 = request_a_block(ptVar20,this);
        if (bVar25) {
          counters::inc_stats_counter(this->m_counters,0x1f,1);
        }
        if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_00247888;
        send_block_requests(this);
      }
      if ((((ptVar20->field_0x5cc & 8) != 0) &&
          (((ptVar20->super_torrent_hot_members).field_0x4b & 2) != 0)) &&
         (((this->field_0x887 & 2) == 0 &&
          ((long)(this->m_became_uninterested).m_time_diff.__r * 1000000 + (this->m_connect).__d.__r
           + 10000000000 < local_80.__r)))) {
        new_piece = torrent::get_piece_to_super_seed
                              (ptVar20,&(this->super_peer_connection_hot_members).m_have_piece);
        superseed_piece(this,(piece_index_t)0xffffffff,new_piece);
      }
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2f])();
      iVar14 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
      if ((char)iVar14 == '\0') {
        plVar3 = &this->m_extensions;
        p_Var19 = (_List_node_base *)plVar3;
        while (p_Var19 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                            *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var19 != (_List_node_base *)plVar3) {
          (**(code **)(*(long *)p_Var19[1]._M_next + 0x150))();
        }
        iVar14 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
        if ((char)iVar14 == '\0') {
          lVar22 = (local_80.__r - (this->m_connect).__d.__r) +
                   (long)(this->m_last_receive).m_time_diff.__r * -1000000;
          if (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
            psVar6 = (this->super_peer_connection_hot_members).m_settings;
            local_88._0_1_ = 0;
            local_90 = (undefined1  [8])&psVar6->m_mutex;
            ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
            local_88._0_1_ = true;
            iVar14 = (psVar6->m_store).m_ints._M_elems[0x11];
            ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
            if (this->m_peer_info != (torrent_peer *)0x0) {
              iVar14 = (*(uint *)&this->m_peer_info->field_0x1b & 0x1f) * 3 + iVar14;
            }
            bVar25 = is_ssl(&this->m_socket);
            bVar12 = is_i2p(&this->m_socket);
            iVar15 = iVar14 + 10;
            if (!bVar25) {
              iVar15 = iVar14;
            }
            iVar14 = iVar15 + 0x14;
            if (!bVar12) {
              iVar14 = iVar15;
            }
            if ((long)iVar14 * 1000000000 < lVar22) {
              _local_90 = errors::make_error_code(timed_out);
              p_Var19 = (_List_node_base *)plVar3;
              do {
                p_Var19 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                             *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                if (p_Var19 == (_List_node_base *)plVar3) {
                  peer_log(this,info,"CONNECT_FAILED","waited %d seconds",
                           (ulong)(uint)((int)(SUB168(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),
                                                      8) >> 0x1a) -
                                        (SUB164(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),0xc)
                                        >> 0x1f)));
                  _local_90 = errors::make_error_code(timed_out);
                  connect_failed(this,(error_code *)local_90);
                  goto LAB_00247888;
                }
                cVar13 = (**(code **)(*(long *)p_Var19[1]._M_next + 0x128))
                                   (p_Var19[1]._M_next,local_90);
              } while (cVar13 != '\0');
            }
          }
          bVar23 = (this->m_channel_state).
                   super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
                   ._M_elems[1].m_val;
          if ((bVar23 & 4) != 0) {
            iVar14 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x33])();
            if ((((long)iVar14 * 1000000000 < lVar22) &&
                (((this->super_peer_connection_hot_members).field_0x28 & 2) == 0)) &&
               (this->m_reading_bytes == 0)) {
              _local_90 = errors::make_error_code(timed_out_inactivity);
              p_Var19 = (_List_node_base *)plVar3;
              do {
                p_Var19 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                             *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                if (p_Var19 == (_List_node_base *)plVar3) {
                  peer_log(this,info,"LAST_ACTIVITY","%d seconds ago",
                           (ulong)(uint)((int)(SUB168(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),
                                                      8) >> 0x1a) -
                                        (SUB164(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),0xc)
                                        >> 0x1f)));
                  _local_90 = errors::make_error_code(timed_out_inactivity);
                  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_90,1,0);
                  goto LAB_00247888;
                }
                cVar13 = (**(code **)(*(long *)p_Var19[1]._M_next + 0x128))
                                   (p_Var19[1]._M_next,local_90);
              } while (cVar13 != '\0');
            }
          }
          psVar6 = (this->super_peer_connection_hot_members).m_settings;
          local_88._0_1_ = 0;
          local_90 = (undefined1  [8])&psVar6->m_mutex;
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
          local_88._0_1_ = true;
          iVar14 = (psVar6->m_store).m_ints._M_elems[0x1b];
          ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
          bVar25 = is_i2p(&this->m_socket);
          if (((((bVar23 & 4) == 0) ||
               (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0)) ||
              (iVar15 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(),
              (char)iVar15 == '\0')) || (lVar22 <= (long)(iVar14 << bVar25 * '\x02') * 1000000000))
          {
            lVar22 = (this->m_connect).__d.__r;
            lVar17 = (long)(this->m_last_unchoke).m_time_diff.__r * 1000000 + lVar22;
            lVar18 = (long)(this->m_last_incoming_request).m_time_diff.__r * 1000000 + lVar22;
            lVar22 = (long)(this->m_last_sent_payload).m_time_diff.__r * 1000000 + lVar22;
            if (lVar18 < lVar17) {
              lVar18 = lVar17;
            }
            if (lVar18 <= lVar22) {
              lVar18 = lVar22;
            }
            if (((((bVar23 & 4) != 0) &&
                 (bVar4 = (this->super_peer_connection_hot_members).field_0x28, (bVar4 & 2) == 0))
                && (((bVar4 & 0x20) == 0 &&
                    (((this->m_requests).
                      super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      .
                      super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      (this->m_requests).
                      super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      .
                      super__Vector_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                      ._M_impl.super__Vector_impl_data._M_finish && (this->m_reading_bytes == 0)))))
                ) && ((this->field_0x887 & 2) != 0)) {
              bVar25 = torrent::is_finished(ptVar20);
              if ((bVar25 || (*(ulong *)&(ptVar20->super_torrent_hot_members).field_0x48 &
                             0x81000000) != 0) &&
                 (uVar24 = local_80.__r - lVar18, 60000000000 < (long)uVar24)) {
                _local_90 = errors::make_error_code(timed_out_no_request);
                p_Var19 = (_List_node_base *)plVar3;
                do {
                  p_Var19 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                               *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
                  if (p_Var19 == (_List_node_base *)plVar3) {
                    peer_log(this,info,"NO_REQUEST","waited %d seconds",uVar24 / 1000000000);
                    _local_90 = errors::make_error_code(timed_out_no_request);
                    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                              (this,local_90,1,0);
                    goto LAB_00247888;
                  }
                  cVar13 = (**(code **)(*(long *)p_Var19[1]._M_next + 0x128))
                                     (p_Var19[1]._M_next,local_90);
                } while (cVar13 != '\0');
              }
            }
            local_60._24_8_ = SEXT48((this->m_became_uninterested).m_time_diff.__r);
            lVar22 = local_80.__r - (this->m_connect).__d.__r;
            local_60._16_8_ = SEXT48((this->m_became_uninteresting).m_time_diff.__r);
            psVar6 = (this->super_peer_connection_hot_members).m_settings;
            local_88._0_1_ = 0;
            local_90 = (undefined1  [8])&psVar6->m_mutex;
            ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
            local_88._0_1_ = true;
            iVar14 = (psVar6->m_store).m_ints._M_elems[0x13];
            ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
            local_68 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[0x1e])();
            psVar6 = (this->super_peer_connection_hot_members).m_settings;
            local_88._0_1_ = 0;
            local_90 = (undefined1  [8])&psVar6->m_mutex;
            ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
            local_88._0_1_ = true;
            iVar15 = (psVar6->m_store).m_ints._M_elems[0x55];
            ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
            if ((((bVar23 & 4) != 0) &&
                (((this->super_peer_connection_hot_members).field_0x28 & 0x10) == 0)) &&
               ((this->field_0x887 & 2) == 0)) {
              lVar17 = local_60._24_8_ * -1000000 + lVar22;
              lVar18 = (long)iVar14 * 1000000000;
              if (lVar18 < lVar17) {
                lVar22 = lVar22 + local_60._16_8_ * -1000000;
                if ((lVar18 < lVar22) &&
                   (iVar15 + -5 <= local_68 ||
                    (int)(((uint)((ulong)*(undefined8 *)
                                          &(local_78->super_torrent_hot_members).field_0x48 >> 0x21)
                          & 0xffffff) - 5) <=
                    (int)((ulong)((long)(local_78->super_torrent_hot_members).m_connections.
                                        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                        .
                                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_78->super_torrent_hot_members).m_connections.
                                       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                       .
                                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                    (int)((ulong)((long)(local_78->m_peers_to_disconnect).
                                        super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_78->m_peers_to_disconnect).
                                       super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
                  _local_90 = errors::make_error_code(timed_out_no_interest);
                  p_Var19 = (_List_node_base *)plVar3;
                  do {
                    p_Var19 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                                 *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base.
                              _M_next;
                    if (p_Var19 == (_List_node_base *)plVar3) {
                      iVar14 = (*(((this->super_peer_connection_hot_members).m_ses)->
                                 super_session_logger)._vptr_session_logger[5])();
                      if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar14) + 0x68) < 0) {
                        auVar9 = SEXT816(lVar17) * SEXT816(0x112e0be826d694b3);
                        auVar10 = SEXT816(lVar22) * SEXT816(0x112e0be826d694b3);
                        peer_log(this,info,"MUTUAL_NO_INTEREST","t1: %d t2: %d",
                                 (ulong)(uint)((int)(auVar9._8_8_ >> 0x1a) - (auVar9._12_4_ >> 0x1f)
                                              ),
                                 (ulong)(uint)((int)(auVar10._8_8_ >> 0x1a) -
                                              (auVar10._12_4_ >> 0x1f)));
                      }
                      _local_90 = errors::make_error_code(timed_out_no_interest);
                      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                                (this,local_90,1,0);
                      goto LAB_00247888;
                    }
                    cVar13 = (**(code **)(*(long *)p_Var19[1]._M_next + 0x128))
                                       (p_Var19[1]._M_next,local_90);
                  } while (cVar13 != '\0');
                }
              }
            }
            ptVar20 = local_78;
            if ((((bVar23 & 4) != 0) &&
                ((this->m_download_queue).
                 super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                 .
                 super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 (this->m_download_queue).
                 super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                 .
                 super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) &&
               ((0 < this->m_quota[1] &&
                (lVar22 = (this->m_connect).__d.__r, iVar14 = (this->m_requested).m_time_diff.__r,
                iVar15 = request_timeout(this),
                lVar22 + (long)iVar15 * 1000000000 + (long)iVar14 * 1000000 < local_80.__r)))) {
              snub_peer(this);
            }
            keep_alive(this);
            if (((((this->field_0x887 & 0x20) != 0) && (-1 < *(short *)&this->field_0x885)) &&
                (0 < this->m_downloaded_last_second)) &&
               (*(int *)&(this->m_statistics).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>
                         .field_0x28 <= this->m_downloaded_last_second + 5000)) {
              this->field_0x887 = this->field_0x887 & 0xdf;
              iVar14 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[5])();
              if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar14) + 0x68) < 0) {
                peer_log(this,info,"SLOW_START","exit slow start: prev-dl: %d dl: %d",
                         (ulong)(uint)this->m_downloaded_last_second,
                         (ulong)*(uint *)&(this->m_statistics).m_stat.
                                          super_array<libtorrent::aux::stat_channel,_6UL>.field_0x28
                        );
              }
            }
            iVar5 = *(int32_t *)
                     &(this->m_statistics).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                      field_0x8;
            this->m_downloaded_last_second =
                 *(int32_t *)
                  &(this->m_statistics).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                   field_0x28;
            this->m_uploaded_last_second = iVar5;
            lVar22 = 0x7f8;
            do {
              stat_channel::second_tick
                        ((stat_channel *)
                         ((long)&(this->super_bandwidth_socket)._vptr_bandwidth_socket + lVar22),
                         local_64);
              lVar22 = lVar22 + 0x10;
            } while (lVar22 != 0x858);
            iVar14 = *(int *)&(this->m_statistics).m_stat.
                              super_array<libtorrent::aux::stat_channel,_6UL>.field_0xc;
            if (this->m_upload_rate_peak < iVar14) {
              this->m_upload_rate_peak = iVar14;
            }
            iVar14 = *(int *)&(this->m_statistics).m_stat.
                              super_array<libtorrent::aux::stat_channel,_6UL>.field_0x2c;
            if (this->m_download_rate_peak < iVar14) {
              this->m_download_rate_peak = iVar14;
            }
            iVar14 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
            if (((char)iVar14 == '\0') &&
               (((ptVar20->super_torrent_hot_members).field_0x4b & 2) != 0)) {
              update_desired_queue_size(this);
              if ((this->m_desired_queue_size == this->m_max_out_request_queue) &&
                 (paVar16 = torrent::alerts(ptVar20),
                 ((paVar16->m_alert_mask)._M_i.m_val >> 9 & 1) != 0)) {
                paVar16 = torrent::alerts(ptVar20);
                torrent::get_handle((torrent *)local_60);
                local_90._0_4_ = 1;
                alert_manager::
                emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
                          (paVar16,(torrent_handle *)local_60,(performance_warning_t *)local_90);
                if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_60._8_8_ !=
                    (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    piVar2 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                                            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                            ).
                                            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + 4);
                    iVar14 = *piVar2;
                    *piVar2 = *piVar2 + -1;
                    UNLOCK();
                  }
                  else {
                    iVar14 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                                             super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                             ).
                                             super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                             ._M_impl.super__Vector_impl_data._M_finish + 4);
                    *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar14 + -1;
                  }
                  if (iVar14 == 1) {
                    (*(code *)(((vector<piece_pos,_piece_index_t> *)local_60._8_8_)->
                              super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                              ).
                              super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                              ._M_impl.super__Vector_impl_data._M_start[3])();
                  }
                }
              }
              iVar14 = session_settings::get_int
                                 ((this->super_peer_connection_hot_members).m_settings,0x4004);
              if ((((this->m_download_queue).
                    super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                    .
                    super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (this->m_download_queue).
                    super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                    .
                    super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                    ._M_impl.super__Vector_impl_data._M_finish) && (0 < this->m_quota[1])) &&
                 ((long)iVar14 * 1000000000 <
                  (local_80.__r - (this->m_connect).__d.__r) +
                  (long)(this->m_last_piece).m_time_diff.__r * -1000000)) {
                iVar15 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger)
                           ._vptr_session_logger[5])();
                if ((short)*(undefined4 *)(CONCAT44(extraout_var_01,iVar15) + 0x68) < 0) {
                  auVar9 = SEXT816((local_80.__r - (this->m_connect).__d.__r) +
                                   (long)(this->m_last_piece).m_time_diff.__r * -1000000) *
                           SEXT816(0x112e0be826d694b3);
                  peer_log(this,info,"PIECE_REQUEST_TIMED_OUT","%d time: %d to: %d",
                           (ulong)(uint)((int)((ulong)((long)(this->m_download_queue).
                                                                                                                          
                                                  super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->m_download_queue).
                                                                                                                
                                                  super_vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                        -0x55555555),
                           (ulong)(uint)((int)(auVar9._8_8_ >> 0x1a) - (auVar9._12_4_ >> 0x1f)),
                           iVar14);
                }
                snub_peer(this);
              }
              fill_send_buffer(this);
            }
          }
          else {
            peer_log(this,info,"NO_HANDSHAKE","waited %d seconds",
                     (ulong)(uint)((int)(SUB168(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),8) >>
                                        0x1a) -
                                  (SUB164(SEXT816(lVar22) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f
                                  )));
            _local_90 = errors::make_error_code(timed_out_no_handshake);
            (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_90,1,0);
          }
        }
      }
      goto LAB_00247888;
    }
  }
  if (((this->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
    counters::inc_stats_counter(this->m_counters,0xe5,-1);
    if ((bVar25) &&
       (ptVar8 = this->m_peer_info, ptVar20->m_num_connecting = ptVar20->m_num_connecting - 1,
       (ptVar8->field_0x1b & 0x80) != 0)) {
      ptVar20->m_num_connecting_seeds = ptVar20->m_num_connecting_seeds - 1;
    }
    puVar1 = &(this->super_peer_connection_hot_members).field_0x28;
    *puVar1 = *puVar1 & 0xfd;
  }
  _local_90 = errors::make_error_code(torrent_aborted);
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,local_90,1,0);
LAB_00247888:
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

void peer_connection::second_tick(int const tick_interval_ms)
	{
		TORRENT_ASSERT(is_single_thread());
		time_point const now = aux::time_now();
		std::shared_ptr<peer_connection> me(self());

		// the invariant check must be run before me is destructed
		// in case the peer got disconnected
		INVARIANT_CHECK;

		auto t = m_torrent.lock();

		std::uint8_t warning = 0;
		// drain the IP overhead from the bandwidth limiters
		if (m_settings.get_bool(settings_pack::rate_limit_ip_overhead) && t)
		{
			warning |= m_ses.use_quota_overhead(*this
				, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
			warning |= m_ses.use_quota_overhead(*t
				, m_statistics.download_ip_overhead()
				, m_statistics.upload_ip_overhead());
		}

		if (warning && t->alerts().should_post<performance_alert>())
		{
			for (int channel = 0; channel < 2; ++channel)
			{
				if (((warning >> channel) & 1u) == 0) continue;
				t->alerts().emplace_alert<performance_alert>(t->get_handle()
					, channel == peer_connection::download_channel
					? performance_alert::download_limit_too_low
					: performance_alert::upload_limit_too_low);
			}
		}

		if (!t || m_disconnecting)
		{
			TORRENT_ASSERT(t || !m_connecting);
			if (m_connecting)
			{
				m_counters.inc_stats_counter(counters::num_peers_half_open, -1);
				if (t) t->dec_num_connecting(m_peer_info);
				m_connecting = false;
			}
			disconnect(errors::torrent_aborted, operation_t::bittorrent);
			return;
		}

		if (m_endgame_mode
			&& m_interesting
			&& m_download_queue.empty()
			&& m_request_queue.empty()
			&& now - seconds(5) >= m_last_request.get(m_connect))
		{
			// this happens when we're in strict end-game
			// mode and the peer could not request any blocks
			// because they were all taken but there were still
			// unrequested blocks. Now, 5 seconds later, there
			// might not be any unrequested blocks anymore, so
			// we should try to pick another block to see
			// if we can pick a busy one
			m_last_request.set(m_connect, now);
			if (request_a_block(*t, *this))
				m_counters.inc_stats_counter(counters::end_game_piece_picks);
			if (m_disconnecting) return;
			send_block_requests();
		}

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& t->ready_for_connections()
			&& !m_peer_interested
			&& m_became_uninterested.get(m_connect) + seconds(10) < now)
		{
			// maybe we need to try another piece, to see if the peer
			// become interested in us then
			superseed_piece(piece_index_t(-1), t->get_piece_to_super_seed(m_have_piece));
		}
#endif

		on_tick();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			e->tick();
		}
		if (is_disconnecting()) return;
#endif

		// if the peer hasn't said a thing for a certain
		// time, it is considered to have timed out
		time_duration d = now - m_last_receive.get(m_connect);

		if (m_connecting)
		{
			int connect_timeout = m_settings.get_int(settings_pack::peer_connect_timeout);
			if (m_peer_info) connect_timeout += 3 * m_peer_info->failcount;

			// SSL and i2p handshakes are slow
			if (is_ssl(m_socket))
				connect_timeout += 10;

#if TORRENT_USE_I2P
			if (is_i2p(m_socket))
				connect_timeout += 20;
#endif

			if (d > seconds(connect_timeout)
				&& can_disconnect(errors::timed_out))
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CONNECT_FAILED", "waited %d seconds"
					, int(total_seconds(d)));
#endif
				connect_failed(errors::timed_out);
				return;
			}
		}

		// if the bw_network flag isn't set, it means we are not even trying to
		// read from this peer's socket. Most likely because we're applying a
		// rate limit. If the peer is "slow" because we are rate limiting it,
		// don't enforce timeouts. However, as soon as we *do* read from the
		// socket, we expect to receive data, and not have timed out. Then we
		// can enforce the timeouts.
		bool const reading_socket = bool(m_channel_state[download_channel] & peer_info::bw_network);

		// TODO: 2 use a deadline_timer for timeouts. Don't rely on second_tick()!
		// Hook this up to connect timeout as well. This would improve performance
		// because of less work in second_tick(), and might let use remove ticking
		// entirely eventually
		if (reading_socket && d > seconds(timeout()) && !m_connecting && m_reading_bytes == 0
			&& can_disconnect(errors::timed_out_inactivity))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "LAST_ACTIVITY", "%d seconds ago"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_inactivity, operation_t::bittorrent);
			return;
		}

		// do not stall waiting for a handshake
		int timeout = m_settings.get_int (settings_pack::handshake_timeout);
#if TORRENT_USE_I2P
		timeout *= is_i2p(m_socket) ? 4 : 1;
#endif
		if (reading_socket
			&& !m_connecting
			&& in_handshake()
			&& d > seconds(timeout))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_HANDSHAKE", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_handshake, operation_t::bittorrent);
			return;
		}

		// disconnect peers that we unchoked, but they didn't send a request in
		// the last 60 seconds, and we haven't been working on servicing a request
		// for more than 60 seconds.
		// but only if we're a seed
		d = now - std::max(std::max(m_last_unchoke.get(m_connect)
			, m_last_incoming_request.get(m_connect))
			, m_last_sent_payload.get(m_connect));

		if (reading_socket
			&& !m_connecting
			&& m_requests.empty()
			&& m_reading_bytes == 0
			&& !m_choked
			&& m_peer_interested
			&& t && t->is_upload_only()
			&& d > seconds(60)
			&& can_disconnect(errors::timed_out_no_request))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "NO_REQUEST", "waited %d seconds"
				, int(total_seconds(d)));
#endif
			disconnect(errors::timed_out_no_request, operation_t::bittorrent);
			return;
		}

		// if the peer hasn't become interested and we haven't
		// become interested in the peer for 10 minutes, it
		// has also timed out.
		time_duration const d1 = now - m_became_uninterested.get(m_connect);
		time_duration const d2 = now - m_became_uninteresting.get(m_connect);
		time_duration const time_limit = seconds(
			m_settings.get_int(settings_pack::inactivity_timeout));

		// if we are close enough to the limit, consider the peer connection
		// list full. This will enable the inactive timeout
		bool const max_session_conns = m_ses.num_connections()
			>= m_settings.get_int(settings_pack::connections_limit) - 5;
		bool const max_torrent_conns = t && t->num_peers()
			>= t->max_connections() - 5;

		// don't bother disconnect peers we haven't been interested
		// in (and that hasn't been interested in us) for a while
		// unless we have used up all our connection slots
		if (reading_socket
			&& !m_interesting
			&& !m_peer_interested
			&& d1 > time_limit
			&& d2 > time_limit
			&& (max_session_conns || max_torrent_conns)
			&& can_disconnect(errors::timed_out_no_interest))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "MUTUAL_NO_INTEREST", "t1: %d t2: %d"
					, int(total_seconds(d1)), int(total_seconds(d2)));
			}
#endif
			disconnect(errors::timed_out_no_interest, operation_t::bittorrent);
			return;
		}

		if (reading_socket
			&& !m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now > m_requested.get(m_connect) + seconds(request_timeout()))
		{
			snub_peer();
		}

		// if we haven't sent something in too long, send a keep-alive
		keep_alive();

		// if our download rate isn't increasing significantly anymore, end slow
		// start. The 10kB is to have some slack here.
		// we can't do this when we're choked, because we aren't sending any
		// requests yet, so there hasn't been an opportunity to ramp up the
		// connection yet.
		if (m_slow_start
			&& !m_peer_choked
			&& m_downloaded_last_second > 0
			&& m_downloaded_last_second + 5000
				>= m_statistics.last_payload_downloaded())
		{
			m_slow_start = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "SLOW_START", "exit slow start: "
					"prev-dl: %d dl: %d"
					, int(m_downloaded_last_second)
					, m_statistics.last_payload_downloaded());
			}
#endif
		}
		m_downloaded_last_second = m_statistics.last_payload_downloaded();
		m_uploaded_last_second = m_statistics.last_payload_uploaded();

		m_statistics.second_tick(tick_interval_ms);

		if (m_statistics.upload_payload_rate() > m_upload_rate_peak)
		{
			m_upload_rate_peak = m_statistics.upload_payload_rate();
		}
		if (m_statistics.download_payload_rate() > m_download_rate_peak)
		{
			m_download_rate_peak = m_statistics.download_payload_rate();
		}
		if (is_disconnecting()) return;

		if (!t->ready_for_connections()) return;

		update_desired_queue_size();

		if (m_desired_queue_size == m_max_out_request_queue
			&& t->alerts().should_post<performance_alert>())
		{
			t->alerts().emplace_alert<performance_alert>(t->get_handle()
				, performance_alert::outstanding_request_limit_reached);
		}

		int const piece_timeout = m_settings.get_int(settings_pack::piece_timeout);

		if (!m_download_queue.empty()
			&& m_quota[download_channel] > 0
			&& now - m_last_piece.get(m_connect) > seconds(piece_timeout))
		{
			// this peer isn't sending the pieces we've
			// requested (this has been observed by BitComet)
			// in this case we'll clear our download queue and
			// re-request the blocks.
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "PIECE_REQUEST_TIMED_OUT"
					, "%d time: %d to: %d"
					, int(m_download_queue.size()), int(total_seconds(now - m_last_piece.get(m_connect)))
					, piece_timeout);
			}
#endif

			snub_peer();
		}

		fill_send_buffer();
	}